

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

void bitset_inplace_difference(bitset_t *b1,bitset_t *b2)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = b2->arraysize;
  if (b1->arraysize < b2->arraysize) {
    uVar3 = b1->arraysize;
  }
  if (uVar3 != 0) {
    puVar1 = b2->array;
    puVar2 = b1->array;
    uVar4 = 0;
    do {
      puVar2[uVar4] = puVar2[uVar4] & ~puVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void bitset_inplace_difference(bitset_t *CROARING_CBITSET_RESTRICT b1,
                               const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k < minlength; ++k) {
        b1->array[k] &= ~(b2->array[k]);
    }
}